

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::LambdaRefExpression::Deserialize(LambdaRefExpression *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  _func_int **pp_Var3;
  LambdaRefExpression *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  undefined1 local_40;
  undefined8 local_3f;
  undefined4 local_37;
  undefined2 local_33;
  char local_31;
  idx_t lambda_idx;
  
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"lambda_idx");
  pp_Var3 = deserializer->_vptr_Deserializer;
  if ((char)uVar1 == '\0') {
    lambda_idx = 0;
  }
  else {
    iVar2 = (*pp_Var3[0x15])(deserializer);
    lambda_idx = CONCAT44(extraout_var,iVar2);
    pp_Var3 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var3[5])(deserializer,(ulong)(uVar1 & 0xff));
  iVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"column_name");
  if ((char)iVar2 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_40 = 0;
    local_90 = &local_80;
    local_80._M_local_buf[0] = '\0';
    local_80._M_allocated_capacity._1_7_ = (undefined7)local_3f;
    local_80._M_local_buf[8] = (char)((ulong)local_3f >> 0x38);
    local_80._9_4_ = local_37;
    local_80._13_2_ = local_33;
    local_80._M_local_buf[0xf] = local_31;
    local_88 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_90,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (LambdaRefExpression *)operator_new(0x60);
  if (local_90 == &local_80) {
    local_70.field_2._8_8_ =
         CONCAT17(local_80._M_local_buf[0xf],
                  CONCAT25(local_80._13_2_,CONCAT41(local_80._9_4_,local_80._M_local_buf[8])));
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)local_90;
  }
  local_70.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
  local_70.field_2._M_local_buf[0] = local_80._M_local_buf[0];
  local_70._M_string_length = local_88;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_90 = &local_80;
  LambdaRefExpression(this_00,lambda_idx,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression = (_func_int **)this_00;
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> LambdaRefExpression::Deserialize(Deserializer &deserializer) {
	auto lambda_idx = deserializer.ReadPropertyWithDefault<idx_t>(200, "lambda_idx");
	auto column_name = deserializer.ReadPropertyWithDefault<string>(201, "column_name");
	auto result = duckdb::unique_ptr<LambdaRefExpression>(new LambdaRefExpression(lambda_idx, std::move(column_name)));
	return std::move(result);
}